

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldsByIndex_Test::TestBody
          (DescriptorTest_FieldsByIndex_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_f0;
  Message local_e8;
  FieldDescriptor *local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_4;
  Message local_c0;
  FieldDescriptor *local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_3;
  Message local_98;
  FieldDescriptor *local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_2;
  Message local_70;
  FieldDescriptor *local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_48;
  Message local_40 [3];
  int local_28 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  DescriptorTest_FieldsByIndex_Test *this_local;
  
  local_28[1] = 4;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_28[0] = Descriptor::field_count((this->super_DescriptorTest).message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_20,"4","message_->field_count()",local_28 + 1,local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x427,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message(local_40);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_68 = Descriptor::field((this->super_DescriptorTest).message_,0);
    testing::internal::EqHelper::
    Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
              ((EqHelper *)local_60,"foo_","message_->field(0)",&(this->super_DescriptorTest).foo_,
               &local_68);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(&local_70);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x428,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_70);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
    local_90 = Descriptor::field((this->super_DescriptorTest).message_,1);
    testing::internal::EqHelper::
    Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
              ((EqHelper *)local_88,"bar_","message_->field(1)",&(this->super_DescriptorTest).bar_,
               &local_90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_98);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x429,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    local_b8 = Descriptor::field((this->super_DescriptorTest).message_,2);
    testing::internal::EqHelper::
    Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
              ((EqHelper *)local_b0,"baz_","message_->field(2)",&(this->super_DescriptorTest).baz_,
               &local_b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar1) {
      testing::Message::Message(&local_c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x42a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    local_e0 = Descriptor::field((this->super_DescriptorTest).message_,3);
    testing::internal::EqHelper::
    Compare<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_nullptr>
              ((EqHelper *)local_d8,"moo_","message_->field(3)",&(this->super_DescriptorTest).moo_,
               &local_e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x42b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      testing::Message::~Message(&local_e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  }
  return;
}

Assistant:

TEST_F(DescriptorTest, FieldsByIndex) {
  ASSERT_EQ(4, message_->field_count());
  EXPECT_EQ(foo_, message_->field(0));
  EXPECT_EQ(bar_, message_->field(1));
  EXPECT_EQ(baz_, message_->field(2));
  EXPECT_EQ(moo_, message_->field(3));
}